

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Mux_ManFree(Mux_Man_t *p)

{
  Abc_NamStop(p->pNames);
  Vec_WecFree(p->vTops);
  free(p);
  return;
}

Assistant:

void Mux_ManFree( Mux_Man_t * p )
{
    Abc_NamStop( p->pNames );
    Vec_WecFree( p->vTops );
    ABC_FREE( p );
}